

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O1

int __thiscall
webfront::http::std::experimental::net::v1::
basic_socket_acceptor<std::experimental::net::v1::ip::tcp>::listen
          (basic_socket_acceptor<std::experimental::net::v1::ip::tcp> *this,int __fd,int __n)

{
  int iVar1;
  error_code ec;
  
  ::std::_V2::system_category();
  iVar1 = detail::reactive_socket_service_base::listen
                    (&((this->
                       super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
                       ).service_)->super_reactive_socket_service_base,(int)this + 8,__fd);
  return iVar1;
}

Assistant:

void listen(int backlog = socket_base::max_listen_connections)
  {
    std::error_code ec;
    this->get_service().listen(this->get_implementation(), backlog, ec);
    std::experimental::net::v1::detail::throw_error(ec, "listen");
  }